

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist_test.cpp
# Opt level: O1

void foreach_test_func(ppointer data,ppointer user_data)

{
  if ((user_data != (ppointer)0x0) && ((ulong)*(uint *)((long)user_data + 0xc) < 3)) {
    *(int *)((long)user_data + (ulong)*(uint *)((long)user_data + 0xc) * 4) = (int)data;
    *(int *)((long)user_data + 0xc) = *(int *)((long)user_data + 0xc) + 1;
  }
  return;
}

Assistant:

static void foreach_test_func (ppointer data, ppointer user_data)
{
	if (user_data == NULL)
		return;

	TestData *test_data = (TestData *) user_data;

	if (test_data->index < 0 || test_data->index > 2)
		return;

	test_data->test_array[test_data->index] = P_POINTER_TO_INT (data);
	++test_data->index;
}